

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::ShaderSource::~ShaderSource(ShaderSource *this)

{
  ShaderSource *this_local;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__ShaderSource_0015c900;
  std::__cxx11::string::~string((string *)&this->source);
  Item::~Item(&this->super_Item);
  return;
}

Assistant:

~ShaderSource		(void) {}